

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_file.c
# Opt level: O2

void test_write_format_zip_file(void)

{
  int *_v1;
  uint uVar1;
  int *piVar2;
  int iVar3;
  tm *ptVar4;
  void *buff;
  archive *_a;
  archive_entry *entry;
  ssize_t v2;
  ulong uVar5;
  uchar *p;
  byte *buff_00;
  ushort *puVar6;
  ushort *puVar7;
  int *piVar8;
  ulong v2_00;
  long lVar9;
  bool bVar10;
  time_t t;
  int *local_58;
  ulong local_50;
  ushort *local_48;
  size_t used;
  char file_data [8];
  
  t = 0x499602d2;
  ptVar4 = localtime(&t);
  buff_00 = (byte *)file_data;
  builtin_strncpy(file_data,"12345678",8);
  buff = malloc(1000000);
  _a = archive_write_new();
  v2_00 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'a',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'b',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_zip(a)",_a);
  iVar3 = archive_write_set_options(_a,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:experimental\")",_a);
  iVar3 = archive_write_open_memory(_a,buff,1000000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'h',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81a4);
  lVar9 = 8;
  archive_entry_set_size(entry,8);
  archive_entry_set_uid(entry,10);
  archive_entry_set_gid(entry,0x14);
  archive_entry_set_mtime(entry,t,0);
  iVar3 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'o',0,"0",(long)iVar3,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(entry);
  v2 = archive_write_data(_a,buff_00,8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'q',8,"8",v2,"archive_write_data(a, file_data, sizeof(file_data))",
                      (void *)0x0);
  iVar3 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",_a);
  iVar3 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L's',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",buff,used);
  puVar6 = (ushort *)((long)buff + (used - 0x16));
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'{',puVar6,"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'}',(ulong)*(ushort *)((long)buff + (used - 0x12)),"i2(p + 4)",0,"0",
                      (void *)0x0);
  failure("Central dir must start on disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x7f',(ulong)*(ushort *)((long)buff + (used - 0x10)),"i2(p + 6)",0,"0",
                      (void *)0x0);
  failure("All central dir entries are on this disk");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x81',(ulong)*(ushort *)((long)buff + (used - 0xe)),"i2(p + 8)",
                      (ulong)*(ushort *)((long)buff + (used - 0xc)),"i2(p + 10)",(void *)0x0);
  uVar1 = *(uint *)((long)buff + (used - 10));
  local_50 = (ulong)*(uint *)((long)buff + (used - 6));
  failure("no zip comment");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x84',(ulong)*(ushort *)((long)buff + (used - 2)),"i2(p + 20)",0,"0",
                      (void *)0x0);
  uVar5 = (ulong)*(uint *)((long)buff + (used - 6));
  local_48 = puVar6;
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",
          (ulong)*(uint *)((long)buff + (used - 10)));
  local_58 = (int *)(uVar5 + (long)buff);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x8d',(int *)(uVar5 + (long)buff),"p","PK\x01\x02","\"PK\\001\\002\"",4,"4"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x8e',(ulong)*(ushort *)((long)buff + uVar5 + 4),"i2(p + 4)",0x314,
                      "3 * 256 + zip_version",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x8f',(ulong)*(ushort *)((long)buff + uVar5 + 6),"i2(p + 6)",0x14,
                      "zip_version",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x90',(ulong)*(ushort *)((long)buff + uVar5 + 8),"i2(p + 8)",8,"8",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x91',(ulong)*(ushort *)((long)buff + uVar5 + 10),"i2(p + 10)",8,
                      "zip_compression",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x92',(ulong)*(ushort *)((long)buff + uVar5 + 0xc),"i2(p + 12)",
                      (long)(ptVar4->tm_sec / 2 + ptVar4->tm_min * 0x20 + ptVar4->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x93',(ulong)*(ushort *)((long)buff + uVar5 + 0xe),"i2(p + 14)",
                      (long)(ptVar4->tm_mon * 0x20 + ptVar4->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar4->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  piVar2 = local_58;
  while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
    v2_00 = v2_00 ^ *buff_00;
    for (iVar3 = -8; iVar3 != 0; iVar3 = iVar3 + 1) {
      uVar5 = v2_00 >> 1 ^ 0xedb88320;
      if ((v2_00 & 1) != 0) {
        uVar5 = v2_00 >> 1;
      }
      v2_00 = uVar5 ^ 0x80000000;
    }
    buff_00 = buff_00 + 1;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x95',(ulong)(uint)local_58[4],"i4(p + 16)",v2_00,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x97',(ulong)(uint)piVar2[6],"i4(p + 24)",8,"sizeof(file_data)",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x98',(ulong)*(ushort *)(piVar2 + 7),"i2(p + 28)",4,"strlen(file_name)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9a',(ulong)*(ushort *)(piVar2 + 8),"i2(p + 32)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9b',(ulong)*(ushort *)((long)piVar2 + 0x22),"i2(p + 34)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9c',(ulong)*(ushort *)(piVar2 + 9),"i2(p + 36)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9d',(ulong)(*(ushort *)(piVar2 + 10) & 0x3ff),"i4(p + 38) >> 16 & 01777",
                      0x1a4,"file_perm",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9e',(ulong)*(uint *)((long)piVar2 + 0x2a),"i4(p + 42)",0,"0",(void *)0x0)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'\x9f',(void *)((long)piVar2 + 0x2e),"p + 46","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  puVar6 = (ushort *)((long)piVar2 + (ulong)*(ushort *)((long)piVar2 + 0x1e) + 0x32);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'£',(ulong)*(ushort *)((long)piVar2 + 0x32),"i2(p)",0x5455,"0x5455",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'¤',(ulong)*(ushort *)(piVar2 + 0xd),"i2(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'¥',(ulong)*(byte *)((long)piVar2 + 0x36),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'¦',(ulong)*(uint *)((long)piVar2 + 0x37),"i4(p + 5)",t,"t",(void *)0x0);
  uVar5 = (ulong)*(ushort *)(piVar2 + 0xd);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'©',(ulong)*(ushort *)((long)piVar2 + uVar5 + 0x36),"i2(p)",0x7875,"0x7875"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'ª',(ulong)*(ushort *)((long)piVar2 + uVar5 + 0x38),"i2(p + 2)",0xb,"11",
                      (void *)0x0);
  for (puVar7 = (ushort *)((long)piVar2 + *(ushort *)((long)piVar2 + uVar5 + 0x38) + uVar5 + 0x3a);
      puVar7 < puVar6; puVar7 = (ushort *)((long)puVar7 + (ulong)puVar7[1] + 4)) {
    failure("Unexpected extension 0x%04X",(ulong)*puVar7);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                     ,L'±',L'\0',"0",(void *)0x0);
  }
  lVar9 = local_50 + uVar1;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'¶',(uint)(puVar7 == puVar6),"p == extension_end",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'¸',(uint)(puVar7 == (ushort *)((long)buff + lVar9)),"p == eocd",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'»',(uint)(puVar7 == local_48),"p == eocd_record",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'¿',buff,"p","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'À',(ulong)*(ushort *)((long)buff + 4),"i2(p + 4)",0x14,"zip_version",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Á',(ulong)*(ushort *)((long)buff + 6),"i2(p + 6)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Â',(ulong)*(ushort *)((long)buff + 8),"i2(p + 8)",8,"zip_compression",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ã',(ulong)*(ushort *)((long)buff + 10),"i2(p + 10)",
                      (long)(ptVar4->tm_sec / 2 + ptVar4->tm_min * 0x20 + ptVar4->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ä',(ulong)*(ushort *)((long)buff + 0xc),"i2(p + 12)",
                      (long)(ptVar4->tm_mon * 0x20 + ptVar4->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar4->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Å',(ulong)*(uint *)((long)buff + 0xe),"i4(p + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'È',(ulong)*(ushort *)((long)buff + 0x1a),"i2(p + 26)",4,
                      "strlen(file_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'É',(ulong)*(ushort *)((long)buff + 0x1c),"i2(p + 28)",0x25,"37",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ê',(void *)((long)buff + 0x1e),"p + 30","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  puVar6 = (ushort *)((long)buff + (ulong)*(ushort *)((long)buff + 0x1c) + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Î',(ulong)*(ushort *)((long)buff + 0x22),"i2(p)",0x5455,"0x5455",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ï',(ulong)*(ushort *)((long)buff + 0x24),"i2(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ð',(ulong)*(byte *)((long)buff + 0x26),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ñ',(ulong)*(uint *)((long)buff + 0x27),"i4(p + 5)",t,"t",(void *)0x0);
  uVar5 = (ulong)*(ushort *)((long)buff + 0x24);
  lVar9 = uVar5 + 0x22;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ô',(ulong)*(ushort *)((long)buff + uVar5 + 0x26),"i2(p)",0x7875,"0x7875",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Õ',(ulong)*(ushort *)((long)buff + uVar5 + 0x28),"i2(p + 2)",0xb,"11",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ö',(ulong)*(byte *)((long)buff + uVar5 + 0x2a),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'×',(ulong)*(byte *)((long)buff + uVar5 + 0x2b),"p[5]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ø',(ulong)*(uint *)((long)buff + uVar5 + 0x2c),"i4(p + 6)",10,"file_uid",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ù',(ulong)*(byte *)((long)buff + uVar5 + 0x30),"p[10]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ú',(ulong)*(uint *)((long)buff + uVar5 + 0x31),"i4(p + 11)",0x14,
                      "file_gid",(void *)0x0);
  uVar5 = (ulong)*(ushort *)((long)buff + uVar5 + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Ý',(ulong)*(ushort *)((long)buff + uVar5 + 8 + lVar9),"i2(p)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'Þ',(ulong)*(ushort *)((long)buff + uVar5 + 10 + lVar9),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'ß',(ulong)*(byte *)((long)buff + uVar5 + 0xc + lVar9),"p[4]",7,"7",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'à',(ulong)*(byte *)((long)buff + uVar5 + 0xe + lVar9),"i2(p + 5) >> 8",3,
                      "3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'á',(ulong)*(ushort *)((long)buff + uVar5 + 0xf + lVar9),"i2(p + 7)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'â',(ulong)(*(ushort *)((long)buff + uVar5 + 0x13 + lVar9) & 0x3ff),
                      "i4(p + 9) >> 16 & 01777",0x1a4,"file_perm",(void *)0x0);
  for (lVar9 = (long)buff + (ulong)*(ushort *)((long)buff + uVar5 + 10 + lVar9) + uVar5 + lVar9 + 8;
      puVar7 = (ushort *)(lVar9 + 4), puVar7 < puVar6;
      lVar9 = (long)puVar7 + (ulong)*(ushort *)(lVar9 + 6)) {
    failure("Unexpected extension 0x%04X",(ulong)*puVar7);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                     ,L'è',L'\0',"0",(void *)0x0);
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'í',(uint)(puVar7 == puVar6),"p == extension_end",(void *)0x0);
  piVar2 = local_58;
  for (piVar8 = (int *)(lVar9 + 0x14); (_v1 = piVar8 + -4, _v1 < local_58 && (*_v1 != 0x8074b50));
      piVar8 = (int *)((long)piVar8 + 1)) {
  }
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'ò',_v1,"p","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'ó',(ulong)(uint)piVar8[-3],"i4(p + 4)",v2_00,"crc",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                      ,L'õ',(ulong)(uint)piVar8[-1],"i4(p + 12)",8,"sizeof(file_data)",(void *)0x0)
  ;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_file.c"
                   ,L'ø',(uint)(piVar8 == piVar2),"p + 16 == central_header",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_file)
{
	struct archive *a;
	struct archive_entry *ae;
	time_t t = 1234567890;
	struct tm *tm = localtime(&t);
	size_t used, buffsize = 1000000;
	unsigned long crc;
	int file_perm = 00644;
	int zip_version = 20;
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_version = 10;
	zip_compression = 0;
#endif

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_size(ae, sizeof(file_data));
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, t, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	eocd = buff + i4(p + 12) + i4(p + 16);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	/* assertEqualInt(i4(p + 20), sizeof(file_data)); */ /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2(central_header + 30);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	/* TODO: verify 'ux' contents */
	p += 4 + i2(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	assert(p == eocd);

	/* Regular EOCD immediately follows central directory. */
	assert(p == eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 6), 8); /* Flags */
	assertEqualInt(i2(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(p + 14), 0); /* CRC-32 */
	/* assertEqualInt(i4(p + 18), sizeof(file_data)); */ /* Compressed size */
	/* assertEqualInt(i4(p + 22), sizeof(file_data)); */ /* Uncompressed size not stored because we're using length-at-end. */
	assertEqualInt(i2(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 28), 37); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2(local_header + 28);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x6c65); /* 'el' experimental extension block */
	assertEqualInt(i2(p + 2), 9); /* size */
	assertEqualInt(p[4], 7); /* bitmap of fields in this block */
	assertEqualInt(i2(p + 5) >> 8, 3); /* System & version made by */
	assertEqualInt(i2(p + 7), 0); /* internal file attributes */
	assertEqualInt(i4(p + 9) >> 16 & 01777, file_perm); /* external file attributes */
	p += 4 + i2(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4(p + 4), crc); /* CRC-32 */
	/* assertEqualInt(i4(p + 8), ???); */ /* compressed size */
	assertEqualInt(i4(p + 12), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the only entry. */
	assert(p + 16 == central_header);

	free(buff);
}